

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubcommandTest.cpp
# Opt level: O0

void __thiscall
SubcommandProgram_HelpOrder_Test::~SubcommandProgram_HelpOrder_Test
          (SubcommandProgram_HelpOrder_Test *this)

{
  SubcommandProgram_HelpOrder_Test *this_local;
  
  SubcommandProgram::~SubcommandProgram(&this->super_SubcommandProgram);
  return;
}

Assistant:

TEST_F(SubcommandProgram, HelpOrder) {

    args = {"-h"};
    EXPECT_THROW(run(), CLI::CallForHelp);

    args = {"start", "-h"};
    EXPECT_THROW(run(), CLI::CallForHelp);

    args = {"-h", "start"};
    EXPECT_THROW(run(), CLI::CallForHelp);
}